

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O0

Float __thiscall pbrt::ImageChannelValues::Average(ImageChannelValues *this)

{
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *this_00;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *pIVar1;
  const_reference pvVar2;
  size_t sVar3;
  InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *in_RDI;
  undefined1 auVar4 [16];
  undefined1 in_ZMM1 [64];
  int i;
  Float sum;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 local_10;
  undefined4 local_c;
  
  local_c = 0.0;
  local_10 = 0;
  while( true ) {
    this_00 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)(long)local_10;
    pIVar1 = (InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
             InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::size(in_RDI);
    auVar4 = in_ZMM1._0_16_;
    if (pIVar1 <= this_00) break;
    pvVar2 = InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                       (this_00,CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
    local_c = *pvVar2 + local_c;
    local_10 = local_10 + 1;
  }
  sVar3 = InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::size(in_RDI);
  auVar4 = vcvtusi2ss_avx512f(auVar4,sVar3);
  return local_c / auVar4._0_4_;
}

Assistant:

Float Average() const {
        Float sum = 0;
        for (int i = 0; i < size(); ++i)
            sum += (*this)[i];
        return sum / size();
    }